

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown34_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  int x;
  int dst_width_local;
  uint16_t *dst_local;
  ptrdiff_t src_stride_local;
  uint16_t *src_ptr_local;
  
  dst_local = dst;
  src_ptr_local = src_ptr;
  for (x = 0; x < dst_width; x = x + 3) {
    *dst_local = *src_ptr_local;
    dst_local[1] = src_ptr_local[1];
    dst_local[2] = src_ptr_local[3];
    dst_local = dst_local + 3;
    src_ptr_local = src_ptr_local + 4;
  }
  return;
}

Assistant:

void ScaleRowDown34_16_C(const uint16_t* src_ptr,
                         ptrdiff_t src_stride,
                         uint16_t* dst,
                         int dst_width) {
  int x;
  (void)src_stride;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (x = 0; x < dst_width; x += 3) {
    dst[0] = src_ptr[0];
    dst[1] = src_ptr[1];
    dst[2] = src_ptr[3];
    dst += 3;
    src_ptr += 4;
  }
}